

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O0

void __thiscall QOpenGLTexturePrivate::allocateImmutableStorage(QOpenGLTexturePrivate *this)

{
  bool bVar1;
  long in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_fffffffffffffeb8;
  Feature in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  GLsizei in_stack_fffffffffffffee0;
  GLenum bindingTarget;
  long lVar2;
  GLuint texture;
  GLenum in_stack_fffffffffffffef0;
  GLenum in_stack_fffffffffffffef4;
  GLenum in_stack_fffffffffffffef8;
  GLenum in_stack_fffffffffffffefc;
  GLenum in_stack_ffffffffffffff00;
  GLuint in_stack_ffffffffffffff04;
  GLsizei in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  GLsizei in_stack_ffffffffffffff10;
  GLsizei in_stack_ffffffffffffff18;
  GLsizei in_stack_ffffffffffffff20;
  GLsizei in_stack_ffffffffffffff28;
  GLsizei in_stack_ffffffffffffff30;
  GLboolean in_stack_ffffffffffffff38;
  char local_b0 [32];
  char local_90 [32];
  char local_70 [32];
  char local_50 [32];
  char local_30 [32];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  bindingTarget = *(GLenum *)(in_RDI + 0x10);
  if (bindingTarget == 0xde0) {
    lVar2 = in_RDI;
    bVar1 = QFlags<QOpenGLTexture::Feature>::testFlag
                      ((QFlags<QOpenGLTexture::Feature> *)
                       CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       in_stack_fffffffffffffebc);
    if (!bVar1) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                 in_stack_fffffffffffffec4,
                 (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      QMessageLogger::warning(local_50,"1D textures are not supported");
      goto LAB_00187cb5;
    }
    QOpenGLTextureHelper::glTextureStorage1D
              ((QOpenGLTextureHelper *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
               ,(GLuint)((ulong)lVar2 >> 0x20),(GLenum)lVar2,bindingTarget,in_stack_fffffffffffffee0
               ,(GLenum)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff00);
  }
  else if (bindingTarget == 0xde1) {
LAB_00187997:
    texture = (GLuint)((ulong)in_RDI >> 0x20);
    QOpenGLTextureHelper::glTextureStorage2D
              ((QOpenGLTextureHelper *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
               ,texture,(GLenum)in_RDI,bindingTarget,in_stack_fffffffffffffee0,texture,
               in_stack_ffffffffffffff00,in_stack_ffffffffffffff08);
  }
  else if (bindingTarget == 0x806f) {
    lVar2 = in_RDI;
    bVar1 = QFlags<QOpenGLTexture::Feature>::testFlag
                      ((QFlags<QOpenGLTexture::Feature> *)
                       CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       in_stack_fffffffffffffebc);
    if (!bVar1) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                 in_stack_fffffffffffffec4,
                 (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      QMessageLogger::warning(&stack0xffffffffffffff30,"3D textures are not supported");
      goto LAB_00187cb5;
    }
    QOpenGLTextureHelper::glTextureStorage3D
              ((QOpenGLTextureHelper *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
               ,in_stack_fffffffffffffef4,in_stack_fffffffffffffef0,(GLenum)((ulong)lVar2 >> 0x20),
               (GLsizei)lVar2,bindingTarget,in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
               in_stack_ffffffffffffff20);
  }
  else {
    if ((bindingTarget == 0x84f5) || (bindingTarget == 0x8513)) goto LAB_00187997;
    if (bindingTarget == 0x8c18) {
      lVar2 = in_RDI;
      bVar1 = QFlags<QOpenGLTexture::Feature>::testFlag
                        ((QFlags<QOpenGLTexture::Feature> *)
                         CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                         in_stack_fffffffffffffebc);
      if ((!bVar1) ||
         (bVar1 = QFlags<QOpenGLTexture::Feature>::testFlag
                            ((QFlags<QOpenGLTexture::Feature> *)
                             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                             in_stack_fffffffffffffebc), !bVar1)) {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                   in_stack_fffffffffffffec4,
                   (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        QMessageLogger::warning(local_70,"1D array textures are not supported");
        goto LAB_00187cb5;
      }
      QOpenGLTextureHelper::glTextureStorage2D
                ((QOpenGLTextureHelper *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (GLuint)((ulong)lVar2 >> 0x20),(GLenum)lVar2,bindingTarget,
                 in_stack_fffffffffffffee0,(GLenum)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff00
                 ,in_stack_ffffffffffffff08);
    }
    else if (bindingTarget == 0x8c1a) {
      lVar2 = in_RDI;
      bVar1 = QFlags<QOpenGLTexture::Feature>::testFlag
                        ((QFlags<QOpenGLTexture::Feature> *)
                         CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                         in_stack_fffffffffffffebc);
      if (!bVar1) {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                   in_stack_fffffffffffffec4,
                   (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        QMessageLogger::warning(local_90,"Array textures are not supported");
        goto LAB_00187cb5;
      }
      QOpenGLTextureHelper::glTextureStorage3D
                ((QOpenGLTextureHelper *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                 in_stack_fffffffffffffef4,in_stack_fffffffffffffef0,(GLenum)((ulong)lVar2 >> 0x20),
                 (GLsizei)lVar2,bindingTarget,in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
                 in_stack_ffffffffffffff20);
    }
    else {
      if (bindingTarget == 0x8c2a) {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                   in_stack_fffffffffffffec4,
                   (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        QMessageLogger::warning(local_30,"Buffer textures do not allocate storage");
        goto LAB_00187cb5;
      }
      if (bindingTarget == 0x9009) {
        lVar2 = in_RDI;
        bVar1 = QFlags<QOpenGLTexture::Feature>::testFlag
                          ((QFlags<QOpenGLTexture::Feature> *)
                           CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                           in_stack_fffffffffffffebc);
        if (!bVar1) {
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)
                     ,(char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                     in_stack_fffffffffffffec4,
                     (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          QMessageLogger::warning(local_b0,"Cubemap Array textures are not supported");
          goto LAB_00187cb5;
        }
        QOpenGLTextureHelper::glTextureStorage3D
                  ((QOpenGLTextureHelper *)
                   CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                   in_stack_fffffffffffffef4,in_stack_fffffffffffffef0,
                   (GLenum)((ulong)lVar2 >> 0x20),(GLsizei)lVar2,bindingTarget,
                   in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
      }
      else if (bindingTarget == 0x9100) {
        lVar2 = in_RDI;
        bVar1 = QFlags<QOpenGLTexture::Feature>::testFlag
                          ((QFlags<QOpenGLTexture::Feature> *)
                           CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                           in_stack_fffffffffffffebc);
        if (!bVar1) {
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)
                     ,(char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                     in_stack_fffffffffffffec4,
                     (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          QMessageLogger::warning(&stack0xffffffffffffff10,"Multisample textures are not supported")
          ;
          goto LAB_00187cb5;
        }
        QOpenGLTextureHelper::glTextureStorage2DMultisample
                  ((QOpenGLTextureHelper *)
                   CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                   in_stack_fffffffffffffef0,(GLenum)((ulong)lVar2 >> 0x20),
                   in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
                   (GLboolean)in_stack_ffffffffffffff20);
      }
      else if (bindingTarget == 0x9102) {
        bVar1 = QFlags<QOpenGLTexture::Feature>::testFlag
                          ((QFlags<QOpenGLTexture::Feature> *)
                           CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                           in_stack_fffffffffffffebc);
        if ((!bVar1) ||
           (bVar1 = QFlags<QOpenGLTexture::Feature>::testFlag
                              ((QFlags<QOpenGLTexture::Feature> *)
                               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                               in_stack_fffffffffffffebc), !bVar1)) {
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)
                     ,(char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                     in_stack_fffffffffffffec4,
                     (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          QMessageLogger::warning
                    (&stack0xfffffffffffffef0,"Multisample array textures are not supported");
          goto LAB_00187cb5;
        }
        QOpenGLTextureHelper::glTextureStorage3DMultisample
                  ((QOpenGLTextureHelper *)
                   CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                   in_stack_ffffffffffffff04,in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                   in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,in_stack_ffffffffffffff20,
                   in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,in_stack_ffffffffffffff38);
      }
    }
  }
  *(undefined1 *)(in_RDI + 0xae) = 1;
LAB_00187cb5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QOpenGLTexturePrivate::allocateImmutableStorage()
{
    switch (target) {
    case QOpenGLTexture::TargetBuffer:
        // Buffer textures get their storage from an external OpenGL buffer
        qWarning("Buffer textures do not allocate storage");
        return;

    case QOpenGLTexture::Target1D:
        if (features.testFlag(QOpenGLTexture::Texture1D)) {
            texFuncs->glTextureStorage1D(textureId, target, bindingTarget, mipLevels, format,
                                         dimensions[0]);
        } else {
            qWarning("1D textures are not supported");
            return;
        }
        break;

    case QOpenGLTexture::Target1DArray:
        if (features.testFlag(QOpenGLTexture::Texture1D)
                && features.testFlag(QOpenGLTexture::TextureArrays)) {
            texFuncs->glTextureStorage2D(textureId, target, bindingTarget, mipLevels, format,
                                         dimensions[0], layers);
        } else {
            qWarning("1D array textures are not supported");
            return;
        }
        break;

    case QOpenGLTexture::Target2D:
    case QOpenGLTexture::TargetCubeMap:
    case QOpenGLTexture::TargetRectangle:
        texFuncs->glTextureStorage2D(textureId, target, bindingTarget, mipLevels, format,
                                     dimensions[0], dimensions[1]);
        break;

    case QOpenGLTexture::Target2DArray:
        if (features.testFlag(QOpenGLTexture::TextureArrays)) {
            texFuncs->glTextureStorage3D(textureId, target, bindingTarget, mipLevels, format,
                                         dimensions[0], dimensions[1], layers);
        } else {
            qWarning("Array textures are not supported");
            return;
        }
        break;

    case QOpenGLTexture::TargetCubeMapArray:
        // Cubemap arrays must specify number of layer-faces (6 * layers) as depth parameter
        if (features.testFlag(QOpenGLTexture::TextureCubeMapArrays)) {
            texFuncs->glTextureStorage3D(textureId, target, bindingTarget, mipLevels, format,
                                         dimensions[0], dimensions[1], 6 * layers);
        } else {
            qWarning("Cubemap Array textures are not supported");
            return;
        }
        break;

    case QOpenGLTexture::Target3D:
        if (features.testFlag(QOpenGLTexture::Texture3D)) {
            texFuncs->glTextureStorage3D(textureId, target, bindingTarget, mipLevels, format,
                                         dimensions[0], dimensions[1], dimensions[2]);
        } else {
            qWarning("3D textures are not supported");
            return;
        }
        break;

    case QOpenGLTexture::Target2DMultisample:
        if (features.testFlag(QOpenGLTexture::ImmutableMultisampleStorage)) {
            texFuncs->glTextureStorage2DMultisample(textureId, target, bindingTarget, samples, format,
                                                    dimensions[0], dimensions[1],
                                                    fixedSamplePositions);
        } else {
            qWarning("Multisample textures are not supported");
            return;
        }
        break;

    case QOpenGLTexture::Target2DMultisampleArray:
        if (features.testFlag(QOpenGLTexture::ImmutableMultisampleStorage)
                && features.testFlag(QOpenGLTexture::TextureArrays)) {
            texFuncs->glTextureStorage3DMultisample(textureId, target, bindingTarget, samples, format,
                                                    dimensions[0], dimensions[1], layers,
                                                    fixedSamplePositions);
        } else {
            qWarning("Multisample array textures are not supported");
            return;
        }
        break;
    }

    storageAllocated = true;
}